

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O1

void __thiscall
wasm::DeNaN::addFunc
          (DeNaN *this,Module *module,Name name,Type type,Literal *literal,
          optional<wasm::BinaryOp> op)

{
  Expression *pEVar1;
  SIMDExtract *pSVar2;
  SIMDExtract *pSVar3;
  Binary *pBVar4;
  Binary *pBVar5;
  Binary *pBVar6;
  Expression *pEVar7;
  Const *pCVar8;
  If *this_00;
  ulong uVar9;
  Signature sig;
  optional<wasm::Type> type_;
  Name name_00;
  HeapType local_98;
  Literal local_90;
  void *local_78;
  Type TStack_70;
  long local_68;
  Literal *local_58;
  Module *local_50;
  Binary *local_48;
  _Head_base<0UL,_wasm::Function_*,_false> local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder builder;
  
  sig.results.id = type.id;
  sig.params.id = type.id;
  local_50 = module;
  func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)module;
  HeapType::HeapType(&local_98,sig);
  local_78 = (void *)0x0;
  TStack_70.id = 0;
  local_68 = 0;
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_40;
  Builder::makeFunction
            (name_00,(HeapType)name.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_98.id,(Expression *)&local_78)
  ;
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  local_58 = literal;
  if (type.id == 6) {
    if (((ulong)op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::BinaryOp> >> 0x20 & 1) != 0) {
      __assert_fail("!op",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                    ,0xab,
                    "void wasm::DeNaN::addFunc(Module *, Name, Type, Literal, std::optional<BinaryOp>)"
                   );
    }
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 6;
    pSVar2 = (SIMDExtract *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    *(undefined8 *)&(pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar2->op = 0;
    pSVar2->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar2->index = 0;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    pSVar2->op = ExtractLaneVecF32x4;
    pSVar2->vec = pEVar1;
    pSVar2->index = '\0';
    SIMDExtract::finalize(pSVar2);
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 6;
    pSVar3 = (SIMDExtract *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    *(undefined8 *)&(pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar3->op = 0;
    pSVar3->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar3->index = 0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    pSVar3->op = ExtractLaneVecF32x4;
    pSVar3->vec = pEVar1;
    pSVar3->index = '\0';
    SIMDExtract::finalize(pSVar3);
    pBVar4 = (Binary *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar4->op = EqFloat32;
    pBVar4->left = (Expression *)pSVar2;
    pBVar4->right = (Expression *)pSVar3;
    Binary::finalize(pBVar4);
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 6;
    pSVar2 = (SIMDExtract *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    *(undefined8 *)&(pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar2->op = 0;
    pSVar2->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar2->index = 0;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    pSVar2->op = ExtractLaneVecF32x4;
    pSVar2->vec = pEVar1;
    pSVar2->index = '\x01';
    SIMDExtract::finalize(pSVar2);
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 6;
    pSVar3 = (SIMDExtract *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    *(undefined8 *)&(pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar3->op = 0;
    pSVar3->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar3->index = 0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    pSVar3->op = ExtractLaneVecF32x4;
    pSVar3->vec = pEVar1;
    pSVar3->index = '\x01';
    SIMDExtract::finalize(pSVar3);
    pBVar5 = (Binary *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar5->op = EqFloat32;
    pBVar5->left = (Expression *)pSVar2;
    pBVar5->right = (Expression *)pSVar3;
    Binary::finalize(pBVar5);
    pBVar6 = (Binary *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar6->op = AndInt32;
    pBVar6->left = (Expression *)pBVar4;
    pBVar6->right = (Expression *)pBVar5;
    Binary::finalize(pBVar6);
    local_48 = pBVar6;
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 6;
    pSVar2 = (SIMDExtract *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    *(undefined8 *)&(pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar2->op = 0;
    pSVar2->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar2->index = 0;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    pSVar2->op = ExtractLaneVecF32x4;
    pSVar2->vec = pEVar1;
    pSVar2->index = '\x02';
    SIMDExtract::finalize(pSVar2);
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 6;
    pSVar3 = (SIMDExtract *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    *(undefined8 *)&(pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar3->op = 0;
    pSVar3->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar3->index = 0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    pSVar3->op = ExtractLaneVecF32x4;
    pSVar3->vec = pEVar1;
    pSVar3->index = '\x02';
    SIMDExtract::finalize(pSVar3);
    pBVar4 = (Binary *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar4->op = EqFloat32;
    pBVar4->left = (Expression *)pSVar2;
    pBVar4->right = (Expression *)pSVar3;
    Binary::finalize(pBVar4);
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 6;
    pSVar2 = (SIMDExtract *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    *(undefined8 *)&(pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar2->op = 0;
    pSVar2->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar2->index = 0;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    (pSVar2->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    pSVar2->op = ExtractLaneVecF32x4;
    pSVar2->vec = pEVar1;
    pSVar2->index = '\x03';
    SIMDExtract::finalize(pSVar2);
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = 6;
    pSVar3 = (SIMDExtract *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    *(undefined8 *)&(pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression =
         0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar3->op = 0;
    pSVar3->vec = (Expression *)0x0;
    *(undefined8 *)&pSVar3->index = 0;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression._id =
         SIMDExtractId;
    (pSVar3->super_SpecificExpression<(wasm::Expression::Id)29>).super_Expression.type.id = 0;
    pSVar3->op = ExtractLaneVecF32x4;
    pSVar3->vec = pEVar1;
    pSVar3->index = '\x03';
    SIMDExtract::finalize(pSVar3);
    pBVar5 = (Binary *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar5->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar5->op = EqFloat32;
    pBVar5->left = (Expression *)pSVar2;
    pBVar5->right = (Expression *)pSVar3;
    Binary::finalize(pBVar5);
    pBVar6 = (Binary *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar6->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar6->op = AndInt32;
    pBVar6->left = (Expression *)pBVar4;
    pBVar6->right = (Expression *)pBVar5;
    Binary::finalize(pBVar6);
    pBVar4 = (Binary *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar4->op = AndInt32;
    pBVar4->left = (Expression *)local_48;
    pBVar4->right = (Expression *)pBVar6;
    Binary::finalize(pBVar4);
  }
  else {
    if (((ulong)op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::BinaryOp> >> 0x20 & 1) == 0) {
      __assert_fail("op",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                    ,0xa7,
                    "void wasm::DeNaN::addFunc(Module *, Name, Type, Literal, std::optional<BinaryOp>)"
                   );
    }
    pEVar1 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar1->_id = LocalGetId;
    *(undefined4 *)(pEVar1 + 1) = 0;
    (pEVar1->type).id = type.id;
    pEVar7 = (Expression *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x18,8);
    pEVar7->_id = LocalGetId;
    *(undefined4 *)(pEVar7 + 1) = 0;
    (pEVar7->type).id = type.id;
    pBVar4 = (Binary *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200)
                        ,0x28,8);
    (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar4->op = op.super__Optional_base<wasm::BinaryOp,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::BinaryOp>._M_payload;
    pBVar4->left = pEVar1;
    pBVar4->right = pEVar7;
    Binary::finalize(pBVar4);
  }
  pEVar1 = (Expression *)
           MixedArena::allocSpace
                     ((MixedArena *)
                      ((long)func._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x200),
                      0x18,8);
  pEVar1->_id = LocalGetId;
  *(undefined4 *)(pEVar1 + 1) = 0;
  (pEVar1->type).id = type.id;
  Literal::Literal(&local_90,local_58);
  pCVar8 = Builder::makeConst((Builder *)&func,&local_90);
  uVar9 = 0x28;
  this_00 = (If *)MixedArena::allocSpace
                            ((MixedArena *)
                             ((long)func._M_t.
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                             0x200),0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_00->condition = (Expression *)pBVar4;
  this_00->ifTrue = pEVar1;
  this_00->ifFalse = (Expression *)pCVar8;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar9;
  If::finalize(this_00,type_);
  (local_40._M_head_impl)->body = (Expression *)this_00;
  Literal::~Literal(&local_90);
  Module::addFunction(local_50,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &local_40);
  if (local_40._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_40,local_40._M_head_impl);
  }
  return;
}

Assistant:

void addFunc(Module* module,
               Name name,
               Type type,
               Literal literal,
               std::optional<BinaryOp> op = {}) {
    Builder builder(*module);
    auto func = Builder::makeFunction(name, Signature(type, type), {});
    // Compare the value to itself to check if it is a NaN, and return 0 if
    // so:
    //
    //   (if (result f*)
    //     (f*.eq
    //       (local.get $0)
    //       (local.get $0)
    //     )
    //     (local.get $0)
    //     (f*.const 0)
    //   )
    Expression* condition;
    if (type != Type::v128) {
      // Generate a simple condition.
      assert(op);
      condition = builder.makeBinary(
        *op, builder.makeLocalGet(0, type), builder.makeLocalGet(0, type));
    } else {
      assert(!op);
      // v128 is trickier as the 128 bits may contain f32s or f64s, and we
      // need to check for nans both ways in principle. However, the f32 NaN
      // pattern is a superset of f64, since it checks less bits (8 bit
      // exponent vs 11), and it is checked in more places (4 32-bit values vs
      // 2 64-bit ones), so we can just check that. That is, this reduces to 4
      // checks of f32s, but is otherwise the same as a check of a single f32.
      //
      // However there is additional complexity, which is that if we do
      // EqVecF32x4 then we get all-1s for each case where we compare equal.
      // That itself is a NaN pattern, which means that running this pass
      // twice would interfere with itself. To avoid that we'd need a way to
      // detect our previous instrumentation and not instrument it, but that
      // is tricky (we can't depend on function names etc. while fuzzing).
      // Instead, extract the lanes and use f32 checks.
      auto getLane = [&](Index index) {
        return builder.makeSIMDExtract(
          ExtractLaneVecF32x4, builder.makeLocalGet(0, type), index);
      };
      auto getLaneCheck = [&](Index index) {
        return builder.makeBinary(EqFloat32, getLane(index), getLane(index));
      };
      auto* firstTwo =
        builder.makeBinary(AndInt32, getLaneCheck(0), getLaneCheck(1));
      auto* lastTwo =
        builder.makeBinary(AndInt32, getLaneCheck(2), getLaneCheck(3));
      condition = builder.makeBinary(AndInt32, firstTwo, lastTwo);
    }
    func->body = builder.makeIf(
      condition, builder.makeLocalGet(0, type), builder.makeConst(literal));
    module->addFunction(std::move(func));
  }